

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWritePla.c
# Opt level: O3

int Io_WritePlaOne(FILE *pFile,Abc_Ntk_t *pNtk)

{
  long *plVar1;
  int iVar2;
  int iVar3;
  size_t __n;
  void *__s;
  void *__s_00;
  char *pcVar4;
  ProgressBar *p;
  Vec_Ptr_t *pVVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  undefined8 *puVar9;
  long lVar10;
  uint uVar11;
  Abc_Obj_t *pAVar12;
  size_t __n_00;
  long lVar13;
  
  pVVar5 = pNtk->vCos;
  uVar8 = pVVar5->nSize;
  __n_00 = (size_t)(int)uVar8;
  if ((long)__n_00 < 1) {
    uVar11 = 0;
  }
  else {
    lVar13 = 0;
    uVar11 = 0;
    do {
      pAVar12 = *(Abc_Obj_t **)
                 (*(long *)(*(long *)(*pVVar5->pArray[lVar13] + 0x20) + 8) +
                 (long)**(int **)((long)pVVar5->pArray[lVar13] + 0x20) * 8);
      if (pAVar12->pNtk->ntkType == ABC_NTK_NETLIST) {
        pAVar12 = (Abc_Obj_t *)pAVar12->pNtk->vObjs->pArray[*(pAVar12->vFanins).pArray];
      }
      uVar8 = 1;
      if ((*(uint *)&pAVar12->field_0x14 & 0xf) == 7) {
        iVar2 = Abc_NodeIsConst(pAVar12);
        if (iVar2 == 0) {
          uVar8 = Abc_SopGetCubeNum((char *)(pAVar12->field_5).pData);
        }
        else {
          iVar2 = Abc_NodeIsConst1(pAVar12);
          uVar8 = (uint)(iVar2 != 0);
        }
      }
      uVar11 = uVar11 + uVar8;
      lVar13 = lVar13 + 1;
      pVVar5 = pNtk->vCos;
      uVar8 = pVVar5->nSize;
      __n_00 = (size_t)(int)uVar8;
    } while (lVar13 < (long)__n_00);
  }
  iVar2 = pNtk->vCis->nSize;
  __n = (size_t)iVar2;
  __s = malloc(__n + 1);
  __s_00 = malloc((long)(int)(uVar8 + 1));
  memset(__s,0x2d,__n);
  *(undefined1 *)((long)__s + __n) = 0;
  memset(__s_00,0x30,__n_00);
  *(undefined1 *)((long)__s_00 + __n_00) = 0;
  fprintf((FILE *)pFile,".i %d\n",__n);
  fprintf((FILE *)pFile,".o %d\n",(ulong)uVar8);
  fwrite(".ilb",4,1,(FILE *)pFile);
  pVVar5 = pNtk->vCis;
  if (0 < pVVar5->nSize) {
    lVar13 = 0;
    do {
      pcVar4 = Abc_ObjName(*(Abc_Obj_t **)
                            (*(long *)(*(long *)(*pVVar5->pArray[lVar13] + 0x20) + 8) +
                            (long)**(int **)((long)pVVar5->pArray[lVar13] + 0x30) * 8));
      fprintf((FILE *)pFile," %s",pcVar4);
      lVar13 = lVar13 + 1;
      pVVar5 = pNtk->vCis;
    } while (lVar13 < pVVar5->nSize);
  }
  fputc(10,(FILE *)pFile);
  fwrite(".ob",3,1,(FILE *)pFile);
  pVVar5 = pNtk->vCos;
  if (0 < pVVar5->nSize) {
    lVar13 = 0;
    do {
      pcVar4 = Abc_ObjName(*(Abc_Obj_t **)
                            (*(long *)(*(long *)(*pVVar5->pArray[lVar13] + 0x20) + 8) +
                            (long)**(int **)((long)pVVar5->pArray[lVar13] + 0x20) * 8));
      fprintf((FILE *)pFile," %s",pcVar4);
      lVar13 = lVar13 + 1;
      pVVar5 = pNtk->vCos;
    } while (lVar13 < pVVar5->nSize);
  }
  fputc(10,(FILE *)pFile);
  fprintf((FILE *)pFile,".p %d\n",(ulong)uVar11);
  pVVar5 = pNtk->vCis;
  if (0 < pVVar5->nSize) {
    lVar13 = 0;
    do {
      *(long *)((long)pVVar5->pArray[lVar13] + 0x40) = lVar13;
      lVar13 = lVar13 + 1;
      pVVar5 = pNtk->vCis;
    } while (lVar13 < pVVar5->nSize);
  }
  p = Extra_ProgressBarStart(_stdout,uVar8);
  pVVar5 = pNtk->vCos;
  if (0 < pVVar5->nSize) {
    lVar13 = 0;
    do {
      plVar1 = (long *)pVVar5->pArray[lVar13];
      if (lVar13 != 0) {
        *(undefined1 *)((long)__s_00 + lVar13 + -1) = 0x30;
      }
      *(undefined1 *)((long)__s_00 + lVar13) = 0x31;
      pAVar12 = *(Abc_Obj_t **)
                 (*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[4] * 8);
      if (pAVar12->pNtk->ntkType == ABC_NTK_NETLIST) {
        pAVar12 = (Abc_Obj_t *)pAVar12->pNtk->vObjs->pArray[*(pAVar12->vFanins).pArray];
      }
      uVar8 = *(uint *)&pAVar12->field_0x14 & 0xf;
      if ((uVar8 == 2) || (uVar8 == 5)) {
        *(char *)((long)__s + (long)(pAVar12->field_6).iTemp) =
             (char)((*(int *)((long)plVar1 + 0x14) << 0x15) >> 0x1f) + '1';
        fprintf((FILE *)pFile,"%s %s\n",__s,__s_00);
        *(undefined1 *)((long)__s + (long)(pAVar12->field_6).iTemp) = 0x2d;
      }
      else {
        if (uVar8 != 7) {
          __assert_fail("Abc_ObjIsCi(pDriver)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioWritePla.c"
                        ,0x70,"int Io_WritePlaOne(FILE *, Abc_Ntk_t *)");
        }
        iVar3 = Abc_NodeIsConst(pAVar12);
        if (iVar3 == 0) {
          iVar3 = Abc_SopIsComplement((char *)(pAVar12->field_5).pData);
          if (iVar3 != 0) {
            __assert_fail("!Abc_SopIsComplement( (char *)pDriver->pData )",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioWritePla.c"
                          ,0x7e,"int Io_WritePlaOne(FILE *, Abc_Ntk_t *)");
          }
          pcVar4 = (char *)(pAVar12->field_5).pData;
          if (*pcVar4 != '\0') {
            uVar6 = (ulong)(pAVar12->vFanins).nSize;
            lVar10 = uVar6 + 3;
            while( true ) {
              if (0 < (int)uVar6) {
                lVar7 = 0;
                do {
                  puVar9 = (undefined8 *)
                           pAVar12->pNtk->vObjs->pArray[(pAVar12->vFanins).pArray[lVar7]];
                  if (*(int *)*puVar9 == 1) {
                    puVar9 = *(undefined8 **)
                              (*(long *)(*(long *)((int *)*puVar9 + 8) + 8) +
                              (long)*(int *)puVar9[4] * 8);
                  }
                  if (iVar2 <= (int)puVar9[8]) {
                    __assert_fail("(int)(ABC_PTRUINT_T)pFanin->pCopy < nInputs",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioWritePla.c"
                                  ,0x87,"int Io_WritePlaOne(FILE *, Abc_Ntk_t *)");
                  }
                  *(char *)((long)__s + (long)(int)puVar9[8]) = pcVar4[lVar7];
                  lVar7 = lVar7 + 1;
                } while (lVar7 < (pAVar12->vFanins).nSize);
              }
              fprintf((FILE *)pFile,"%s %s\n",__s,__s_00);
              if (pcVar4[lVar10] == '\0') break;
              pcVar4 = pcVar4 + lVar10;
              uVar6 = (ulong)(uint)(pAVar12->vFanins).nSize;
            }
          }
          if (0 < (pAVar12->vFanins).nSize) {
            lVar10 = 0;
            do {
              puVar9 = (undefined8 *)pAVar12->pNtk->vObjs->pArray[(pAVar12->vFanins).pArray[lVar10]]
              ;
              if (*(int *)*puVar9 == 1) {
                puVar9 = *(undefined8 **)
                          (*(long *)(*(long *)((int *)*puVar9 + 8) + 8) +
                          (long)*(int *)puVar9[4] * 8);
              }
              uVar8 = *(uint *)((long)puVar9 + 0x14) & 0xf;
              if ((uVar8 != 2) && (uVar8 != 5)) {
                __assert_fail("Abc_ObjIsCi(pFanin)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioWritePla.c"
                              ,0x90,"int Io_WritePlaOne(FILE *, Abc_Ntk_t *)");
              }
              *(undefined1 *)((long)__s + (long)*(int *)(puVar9 + 8)) = 0x2d;
              lVar10 = lVar10 + 1;
            } while (lVar10 < (pAVar12->vFanins).nSize);
          }
          if ((p == (ProgressBar *)0x0) || (p->nItemsNext <= lVar13)) {
            Extra_ProgressBarUpdate_int(p,(int)lVar13,(char *)0x0);
          }
        }
        else {
          iVar3 = Abc_NodeIsConst1(pAVar12);
          if (iVar3 != 0) {
            fprintf((FILE *)pFile,"%s %s\n",__s,__s_00);
          }
        }
      }
      lVar13 = lVar13 + 1;
      pVVar5 = pNtk->vCos;
    } while (lVar13 < pVVar5->nSize);
  }
  Extra_ProgressBarStop(p);
  fwrite(".e\n",3,1,(FILE *)pFile);
  pVVar5 = pNtk->vCis;
  if (0 < pVVar5->nSize) {
    lVar13 = 0;
    do {
      *(undefined8 *)((long)pVVar5->pArray[lVar13] + 0x40) = 0;
      lVar13 = lVar13 + 1;
      pVVar5 = pNtk->vCis;
    } while (lVar13 < pVVar5->nSize);
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  if (__s_00 != (void *)0x0) {
    free(__s_00);
  }
  return 1;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Writes the network in PLA format.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Io_WritePlaOne( FILE * pFile, Abc_Ntk_t * pNtk )
{
    ProgressBar * pProgress;
    Abc_Obj_t * pNode, * pFanin, * pDriver;
    char * pCubeIn, * pCubeOut, * pCube;
    int i, k, nProducts, nInputs, nOutputs, nFanins;

    nProducts = 0;
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        pDriver = Abc_ObjFanin0Ntk( Abc_ObjFanin0(pNode) );
        if ( !Abc_ObjIsNode(pDriver) )
        {
            nProducts++;
            continue;
        }
        if ( Abc_NodeIsConst(pDriver) )
        {
            if ( Abc_NodeIsConst1(pDriver) )
                nProducts++;
            continue;
        }
        nProducts += Abc_SopGetCubeNum((char *)pDriver->pData);
    }

    // collect the parameters
    nInputs  = Abc_NtkCiNum(pNtk);
    nOutputs = Abc_NtkCoNum(pNtk);
    pCubeIn  = ABC_ALLOC( char, nInputs + 1 );
    pCubeOut = ABC_ALLOC( char, nOutputs + 1 );
    memset( pCubeIn,  '-', nInputs );     pCubeIn[nInputs]   = 0;
    memset( pCubeOut, '0', nOutputs );    pCubeOut[nOutputs] = 0;

    // write the header
    fprintf( pFile, ".i %d\n", nInputs );
    fprintf( pFile, ".o %d\n", nOutputs );
    fprintf( pFile, ".ilb" );
    Abc_NtkForEachCi( pNtk, pNode, i )
        fprintf( pFile, " %s", Abc_ObjName(Abc_ObjFanout0(pNode)) );
    fprintf( pFile, "\n" );
    fprintf( pFile, ".ob" );
    Abc_NtkForEachCo( pNtk, pNode, i )
        fprintf( pFile, " %s", Abc_ObjName(Abc_ObjFanin0(pNode)) );
    fprintf( pFile, "\n" );
    fprintf( pFile, ".p %d\n", nProducts );

    // mark the CI nodes
    Abc_NtkForEachCi( pNtk, pNode, i )
        pNode->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)i;

    // write the cubes
    pProgress = Extra_ProgressBarStart( stdout, nOutputs );
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        // prepare the output cube
        if ( i - 1 >= 0 )
            pCubeOut[i-1] = '0';
        pCubeOut[i] = '1';

        // consider special cases of nodes
        pDriver = Abc_ObjFanin0Ntk( Abc_ObjFanin0(pNode) );
        if ( !Abc_ObjIsNode(pDriver) )
        {
            assert( Abc_ObjIsCi(pDriver) );
            pCubeIn[(int)(ABC_PTRUINT_T)pDriver->pCopy] = '1' - Abc_ObjFaninC0(pNode);
            fprintf( pFile, "%s %s\n", pCubeIn, pCubeOut );
            pCubeIn[(int)(ABC_PTRUINT_T)pDriver->pCopy] = '-';
            continue;
        }
        if ( Abc_NodeIsConst(pDriver) )
        {
            if ( Abc_NodeIsConst1(pDriver) )
                fprintf( pFile, "%s %s\n", pCubeIn, pCubeOut );
            continue;
        }

        // make sure the cover is not complemented
        assert( !Abc_SopIsComplement( (char *)pDriver->pData ) );

        // write the cubes
        nFanins = Abc_ObjFaninNum(pDriver);
        Abc_SopForEachCube( (char *)pDriver->pData, nFanins, pCube )
        {
            Abc_ObjForEachFanin( pDriver, pFanin, k )
            {
                pFanin = Abc_ObjFanin0Ntk(pFanin);
                assert( (int)(ABC_PTRUINT_T)pFanin->pCopy < nInputs );
                pCubeIn[(int)(ABC_PTRUINT_T)pFanin->pCopy] = pCube[k];
            }
            fprintf( pFile, "%s %s\n", pCubeIn, pCubeOut );
        }
        // clean the cube for future writing
        Abc_ObjForEachFanin( pDriver, pFanin, k )
        {
            pFanin = Abc_ObjFanin0Ntk(pFanin);
            assert( Abc_ObjIsCi(pFanin) );
            pCubeIn[(int)(ABC_PTRUINT_T)pFanin->pCopy] = '-';
        }
        Extra_ProgressBarUpdate( pProgress, i, NULL );
    }
    Extra_ProgressBarStop( pProgress );
    fprintf( pFile, ".e\n" );

    // clean the CI nodes
    Abc_NtkForEachCi( pNtk, pNode, i )
        pNode->pCopy = NULL;
    ABC_FREE( pCubeIn );
    ABC_FREE( pCubeOut );
    return 1;
}